

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict spec_qual_list(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  bool bVar2;
  node_t_conflict n;
  node_t_conflict pnStack_48;
  int first_p;
  node_t_conflict arg;
  node_t_conflict r;
  node_t_conflict op;
  node_t_conflict list;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  pnStack_48 = (node_t_conflict)0x0;
  n = new_node(c2m_ctx,N_LIST);
  bVar2 = true;
  do {
    if (((((short)*(undefined4 *)ppVar1->curr_token == 0x11e) ||
         ((short)*(undefined4 *)ppVar1->curr_token == 0x12e)) ||
        ((short)*(undefined4 *)ppVar1->curr_token == 0x13b)) ||
       ((short)*(undefined4 *)ppVar1->curr_token == 0x114)) {
      r = type_qual(c2m_ctx,no_err_p);
      if (r == &err_struct) {
        return &err_struct;
      }
    }
    else {
      pnStack_48 = try_arg_f(c2m_ctx,type_spec,pnStack_48);
      r = pnStack_48;
      if (pnStack_48 == &err_struct) {
        if (!bVar2) {
          return n;
        }
        c2m_ctx_local = (c2m_ctx_t)&err_struct;
        return (node_t_conflict)c2m_ctx_local;
      }
    }
    op_append(c2m_ctx,n,r);
    bVar2 = false;
  } while( true );
}

Assistant:

D (spec_qual_list) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, op, r, arg = NULL;
  int first_p;

  list = new_node (c2m_ctx, N_LIST);
  for (first_p = TRUE;; first_p = FALSE) {
    if (C (T_CONST) || C (T_RESTRICT) || C (T_VOLATILE) || C (T_ATOMIC)) {
      P (type_qual);
      op = r;
    } else if ((op = TRY_A (type_spec, arg)) != err_node) {
      arg = op;
    } else if (first_p) {
      return err_node;
    } else {
      break;
    }
    op_append (c2m_ctx, list, op);
  }
  return list;
}